

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

string * __thiscall
helics::CommonCore::coreQuery_abi_cxx11_
          (string *__return_storage_ptr__,CommonCore *this,string_view queryStr,bool force_ordering)

{
  data *this_00;
  value_t vVar1;
  ushort index;
  FedInfo **ppFVar2;
  pointer ptVar3;
  pointer ppVar4;
  pointer pcVar5;
  json_value jVar6;
  string_view request;
  undefined8 uVar7;
  size_t __n;
  bool bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  const_iterator cVar12;
  string *val;
  string *psVar13;
  reference pvVar14;
  long lVar15;
  uint uVar16;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *tag;
  undefined8 uVar17;
  pointer ppVar18;
  FedInfo **ppFVar19;
  FedInfo **ppFVar20;
  code *pcVar21;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar22;
  FedInfo *pFVar23;
  ulong uVar24;
  JsonMapBuilder *this_01;
  helics *phVar25;
  size_type __rlen;
  char *pcVar26;
  string_view request_00;
  string_view fmt;
  format_args args;
  json tagBlock_1;
  json base;
  string interfaceQueryResult;
  string res;
  function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  *in_stack_fffffffffffffe68;
  _Any_data local_188;
  undefined1 local_178 [24];
  data local_160;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  string local_140;
  Time local_120;
  Time local_118;
  json_value jStack_110;
  _Alloc_hider local_108;
  undefined1 local_100 [16];
  data local_f0;
  undefined1 local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  key_type local_c0;
  key_type local_a0;
  undefined1 local_80 [32];
  undefined1 local_60 [16];
  data local_50;
  data local_40;
  
  local_150._M_str = queryStr._M_str;
  local_150._M_len = queryStr._M_len;
  quickCoreQueries_abi_cxx11_((string *)local_e0,this,queryStr);
  if (local_e0._8_8_ != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._0_8_ == &local_d0) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_d0._M_allocated_capacity._1_7_,local_d0._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_d0._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_e0._0_8_;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_d0._M_allocated_capacity._1_7_,local_d0._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_e0._8_8_;
    local_e0._8_8_ = 0;
    local_d0._M_local_buf[0] = '\0';
    local_e0._0_8_ = &local_d0;
    goto LAB_0031225f;
  }
  if ((helics *)local_150._M_len == (helics *)0x4) {
    iVar9 = bcmp(local_150._M_str,"tags",4);
    if (iVar9 == 0) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_140,(initializer_list_t)ZEXT816(0),false,object);
      ppVar18 = (this->tags).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar4 = (this->tags).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar18 != ppVar4) {
        do {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_f0,&ppVar18->second);
          pcVar5 = (ppVar18->first)._M_dataplus._M_p;
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,pcVar5,pcVar5 + (ppVar18->first)._M_string_length);
          pvVar14 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)&local_140,&local_a0);
          vVar1 = (pvVar14->m_data).m_type;
          (pvVar14->m_data).m_type = local_f0.m_type;
          jVar6 = (pvVar14->m_data).m_value;
          (pvVar14->m_data).m_value = local_f0.m_value;
          local_f0.m_type = vVar1;
          local_f0.m_value = jVar6;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_f0);
          ppVar18 = ppVar18 + 1;
        } while (ppVar18 != ppVar4);
      }
      fileops::generateJsonString(__return_storage_ptr__,(json *)&local_140,true);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_140);
      goto LAB_0031225f;
    }
  }
  else if (((helics *)local_150._M_len == (helics *)0x9) &&
          (iVar9 = bcmp(local_150._M_str,"federates",9), iVar9 == 0)) {
    local_108._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = local_108._M_p;
    *(undefined2 *)&__return_storage_ptr__->field_2 = 0x5b;
    __return_storage_ptr__->_M_string_length = 1;
    if ((this->loopFederates).dataStorage.csize == 0) {
      uVar24 = (ulong)(this->loopFederates).dataStorage.bsize;
      ppFVar19 = (this->loopFederates).dataStorage.dataptr;
      if (uVar24 == 0x20) {
        if (ppFVar19 == (FedInfo **)0x0) {
          ppFVar19 = &gmlc::containers::
                      StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
                      ::emptyValue;
        }
        else {
          ppFVar19 = ppFVar19 + (long)(this->loopFederates).dataStorage.dataSlotIndex + 1;
        }
        goto LAB_003124f1;
      }
      ppFVar19 = ppFVar19 + (this->loopFederates).dataStorage.dataSlotIndex;
      pFVar23 = *ppFVar19 + uVar24;
    }
    else {
      ppFVar19 = (this->loopFederates).dataStorage.dataptr;
LAB_003124f1:
      pFVar23 = *ppFVar19;
      uVar24 = 0;
    }
    uVar10 = (this->loopFederates).dataStorage.bsize;
    ppFVar2 = (this->loopFederates).dataStorage.dataptr;
    lVar15 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
    if (ppFVar2 == (FedInfo **)0x0) {
      ppFVar20 = &gmlc::containers::
                  StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
                  emptyValue;
    }
    else {
      ppFVar20 = ppFVar2 + lVar15 + 1;
    }
    uVar16 = 0;
    if (uVar10 != 0x20) {
      uVar16 = uVar10;
    }
    local_120.internalTimeCode = (baseType)(ppFVar2 + lVar15);
    if (uVar10 == 0x20) {
      local_120.internalTimeCode = (baseType)ppFVar20;
    }
    if (((uint)uVar24 != uVar16) || (ppFVar19 != (FedInfo **)local_120.internalTimeCode)) {
      this_00 = (data *)(local_178 + 0x18);
      do {
        local_188._M_unused._M_object = local_178;
        pcVar5 = (pFVar23->fed->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_188,pcVar5,pcVar5 + (pFVar23->fed->name)._M_string_length);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)this_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_188);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::dump(&local_140,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)this_00,-1,' ',true,hex);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(this_00);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,local_140._M_dataplus._M_p,local_140._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,
                          CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                                   local_140.field_2._M_local_buf[0]) + 1);
        }
        if ((CommonCore *)local_188._M_unused._0_8_ != (CommonCore *)local_178) {
          operator_delete(local_188._M_unused._M_object,(ulong)(local_178._0_8_ + 1));
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,',');
        iVar9 = (int)uVar24;
        uVar10 = iVar9 + 1;
        if (iVar9 < 0x1f) {
          pFVar23 = pFVar23 + 1;
        }
        else {
          ppFVar19 = ppFVar19 + (ulong)(iVar9 - 0x1fU >> 5) + 1;
          uVar10 = uVar10 & 0x1f;
          pFVar23 = (FedInfo *)((long)&(*ppFVar19)->fed + (ulong)(uVar10 << 4));
        }
        uVar24 = (ulong)uVar10;
      } while ((uVar10 != uVar16) || (ppFVar19 != (FedInfo **)local_120.internalTimeCode));
    }
    if (__return_storage_ptr__->_M_string_length < 2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,']');
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] = ']'
      ;
    }
    goto LAB_0031225f;
  }
  iVar9 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_150,0,4,"tag/")
  ;
  if (iVar9 == 0) {
    ppVar18 = (this->tags).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar4 = (this->tags).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar18 != ppVar4) {
      pcVar26 = local_150._M_str + 4;
      phVar25 = (helics *)(local_150._M_len + -4);
      do {
        bVar8 = phVar25 == (helics *)(ppVar18->first)._M_string_length;
        if (bVar8 && phVar25 != (helics *)0x0) {
          iVar9 = bcmp(pcVar26,(ppVar18->first)._M_dataplus._M_p,(size_t)phVar25);
          bVar8 = iVar9 == 0;
        }
        if (bVar8) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_140,&ppVar18->second);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::dump(__return_storage_ptr__,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_140,-1,' ',true,hex);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_140);
          if (bVar8) goto LAB_0031225f;
        }
        ppVar18 = ppVar18 + 1;
      } while (ppVar18 != ppVar4);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"\"","");
    goto LAB_0031225f;
  }
  aVar22.values_ = (value<fmt::v11::context> *)&local_188;
  local_188._8_8_ = (CommonCore *)0x0;
  local_178._8_8_ =
       std::
       _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:2895:22)>
       ::_M_invoke;
  local_178._0_8_ =
       std::
       _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:2895:22)>
       ::_M_manager;
  request_00._M_str = (char *)&this->loopHandles;
  request_00._M_len = (size_t)local_150._M_str;
  local_188._M_unused._M_object = this;
  generateInterfaceQueryResults
            (&local_140,(helics *)local_150._M_len,request_00,(HandleManager *)0x8831d580,
             (GlobalFederateId)aVar22._0_4_,in_stack_fffffffffffffe68);
  if ((_func_int **)local_178._0_8_ != (_func_int **)0x0) {
    (*(code *)local_178._0_8_)(&local_188,&local_188,3);
  }
  pcVar26 = local_150._M_str;
  __n = local_150._M_len;
  if (local_140._M_string_length == 0) {
    phVar25 = (helics *)(local_150._M_len + -4);
    switch(phVar25) {
    case (helics *)0x0:
switchD_00312386_caseD_0:
      iVar9 = bcmp(pcVar26,"logs",__n);
      if (iVar9 == 0) {
        local_160.m_type = 0;
        local_160.m_value.object = (object_t *)0x0;
        local_178._0_8_ = (_func_int **)0x0;
        local_178._8_8_ = (_func_int **)0x0;
        local_188._M_unused._M_object = (CommonCore *)0x0;
        local_188._8_8_ = (CommonCore *)0x0;
        loadBasicJsonInfo(this,(json *)(local_178 + 0x18),
                          (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                           *)&local_188);
        if ((_func_int **)local_178._0_8_ != (_func_int **)0x0) {
          (*(code *)local_178._0_8_)(&local_188,&local_188,3);
        }
        bufferToJson(&((this->super_BrokerBase).mLogManager.
                       super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      mLogBuffer,(json *)(local_178 + 0x18));
        fileops::generateJsonString(__return_storage_ptr__,(json *)(local_178 + 0x18),true);
        goto LAB_00313239;
      }
      switch(__n) {
      case 7:
        goto switchD_00312386_caseD_3;
      case 10:
        goto switchD_00312836_caseD_a;
      case 0xb:
        goto switchD_00312386_caseD_7;
      case 0xc:
        goto switchD_00312386_caseD_8;
      case 0xd:
        goto switchD_00312386_caseD_9;
      case 0x12:
        goto switchD_00312386_caseD_e;
      }
      break;
    case (helics *)0x2:
switchD_00312386_caseD_2:
      iVar9 = bcmp(pcVar26,"isinit",__n);
      if (iVar9 == 0) {
        bVar8 = allInitReady(this);
        pcVar26 = "false";
        if (bVar8) {
          pcVar26 = "true";
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,pcVar26,pcVar26 + ((ulong)bVar8 ^ 5));
        goto LAB_00312538;
      }
      switch(phVar25) {
      case (helics *)0x0:
        goto switchD_00312386_caseD_0;
      case (helics *)0x3:
        goto switchD_00312386_caseD_3;
      case (helics *)0x6:
        goto switchD_00312836_caseD_a;
      case (helics *)0x7:
        goto switchD_00312386_caseD_7;
      case (helics *)0x8:
        goto switchD_00312386_caseD_8;
      case (helics *)0x9:
        goto switchD_00312386_caseD_9;
      case (helics *)0xe:
        goto switchD_00312386_caseD_e;
      }
      break;
    case (helics *)0x3:
switchD_00312386_caseD_3:
      iVar9 = bcmp(pcVar26,"address",__n);
      if (iVar9 == 0) {
        psVar13 = getAddress_abi_cxx11_(this);
        generateJsonQuotedString(__return_storage_ptr__,psVar13);
        goto LAB_00312538;
      }
      switch(__n) {
      case 7:
        iVar9 = bcmp(pcVar26,"counter",__n);
        if (iVar9 == 0) {
          iVar9 = generateMapObjectCounter(this);
          local_188._0_4_ = iVar9;
          fmt.size_ = 1;
          fmt.data_ = (char *)0x2;
          args.field_1.args_ = aVar22.args_;
          args.desc_ = (unsigned_long_long)&local_188;
          ::fmt::v11::vformat_abi_cxx11_(__return_storage_ptr__,(v11 *)0x44c60e,fmt,args);
          goto LAB_00312538;
        }
        switch(__n) {
        case 10:
          goto switchD_00312836_caseD_a;
        case 0xb:
          goto switchD_00312386_caseD_7;
        case 0xc:
          goto switchD_00312386_caseD_8;
        case 0xd:
          goto switchD_00312386_caseD_9;
        case 0x12:
          goto switchD_00312386_caseD_e;
        }
        break;
      case 10:
        goto switchD_00312836_caseD_a;
      case 0xb:
        goto switchD_00312386_caseD_7;
      case 0xc:
        goto switchD_00312386_caseD_8;
      case 0xd:
        goto switchD_00312386_caseD_9;
      case 0x12:
        goto switchD_00312386_caseD_e;
      }
      break;
    case (helics *)0x5:
      iVar9 = bcmp(local_150._M_str,"dependson",local_150._M_len);
      if (iVar9 == 0) {
        BaseTimeCoordinator::getDependencies
                  ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                   &local_188,
                   (this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
        generateStringVector<std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>,helics::CommonCore::coreQuery[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)const::__6>
                  (__return_storage_ptr__,&local_188);
        goto LAB_00312e48;
      }
      switch(phVar25) {
      case (helics *)0x0:
        goto switchD_00312386_caseD_0;
      case (helics *)0x2:
        goto switchD_00312386_caseD_2;
      case (helics *)0x3:
        goto switchD_00312386_caseD_3;
      case (helics *)0x6:
        goto switchD_00312386_caseD_6;
      case (helics *)0x7:
        goto switchD_00312386_caseD_7;
      case (helics *)0x8:
        goto switchD_00312386_caseD_8;
      case (helics *)0x9:
        goto switchD_00312386_caseD_9;
      case (helics *)0xe:
        goto switchD_00312386_caseD_e;
      }
      break;
    case (helics *)0x6:
switchD_00312386_caseD_6:
      iVar9 = bcmp(pcVar26,"dependents",__n);
      if (iVar9 != 0) {
        switch(phVar25) {
        case (helics *)0x0:
          goto switchD_00312386_caseD_0;
        case (helics *)0x2:
          goto switchD_00312386_caseD_2;
        case (helics *)0x3:
          goto switchD_00312386_caseD_3;
        case (helics *)0x6:
          goto switchD_00312836_caseD_a;
        case (helics *)0x7:
          goto switchD_00312386_caseD_7;
        case (helics *)0x8:
          goto switchD_00312386_caseD_8;
        case (helics *)0x9:
          goto switchD_00312386_caseD_9;
        case (helics *)0xe:
          goto switchD_00312386_caseD_e;
        }
        break;
      }
      BaseTimeCoordinator::getDependents
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 &local_188,
                 (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      generateStringVector<std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>,helics::CommonCore::coreQuery[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,bool)const::__7>
                (__return_storage_ptr__,&local_188);
LAB_00312e48:
      if ((CommonCore *)local_188._M_unused._0_8_ == (CommonCore *)0x0) goto LAB_00312538;
      pcVar21 = (code *)(local_178._0_8_ - local_188._0_8_);
      goto LAB_00312e5e;
    case (helics *)0x7:
switchD_00312386_caseD_7:
      iVar9 = bcmp(pcVar26,"version_all",__n);
      if (iVar9 == 0) {
        local_160.m_type = 0;
        local_160.m_value.object = (object_t *)0x0;
        local_188._M_unused._M_object = (CommonCore *)0x0;
        local_188._8_8_ = (CommonCore *)0x0;
        local_178._8_8_ =
             std::
             _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:2962:33)>
             ::_M_invoke;
        local_178._0_8_ =
             std::
             _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:2962:33)>
             ::_M_manager;
        loadBasicJsonInfo(this,(json *)(local_178 + 0x18),
                          (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                           *)&local_188);
        if ((_func_int **)local_178._0_8_ != (_func_int **)0x0) {
          (*(code *)local_178._0_8_)(&local_188,&local_188,3);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json<const_char_*const_&,_const_char_*,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_40,&versionString);
        pvVar14 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)(local_178 + 0x18),"version");
        vVar1 = (pvVar14->m_data).m_type;
        (pvVar14->m_data).m_type = local_40.m_type;
        jVar6 = (pvVar14->m_data).m_value;
        (pvVar14->m_data).m_value = local_40.m_value;
        local_40.m_type = vVar1;
        local_40.m_value = jVar6;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_40);
        fileops::generateJsonString(__return_storage_ptr__,(json *)(local_178 + 0x18),true);
        goto LAB_00313239;
      }
      if ((helics *)__n == (helics *)0xa) goto switchD_00312836_caseD_a;
      if ((helics *)__n == (helics *)0xd) goto switchD_00312386_caseD_9;
      break;
    case (helics *)0x8:
switchD_00312386_caseD_8:
      iVar9 = bcmp(pcVar26,"current_time",__n);
      if (iVar9 == 0) {
        if ((this->super_BrokerBase).hasTimeDependency == false) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{}","");
        }
        else {
          (*((this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->
            _vptr_BaseTimeCoordinator[0xb])(__return_storage_ptr__);
        }
        goto LAB_00312538;
      }
      if ((helics *)__n == (helics *)0xa) goto switchD_00312836_caseD_a;
      if ((helics *)__n == (helics *)0xd) goto switchD_00312386_caseD_9;
      if ((helics *)__n == (helics *)0xb) goto switchD_00312386_caseD_7;
      break;
    case (helics *)0x9:
switchD_00312386_caseD_9:
      iVar9 = bcmp(pcVar26,"current_state",__n);
      if (iVar9 != 0) {
        if ((helics *)__n == (helics *)0xa) {
switchD_00312836_caseD_a:
          iVar9 = bcmp(pcVar26,"interfaces",__n);
          if (iVar9 == 0) {
            local_160.m_type = 0;
            local_160.m_value.object = (object_t *)0x0;
            local_188._8_8_ = (CommonCore *)0x0;
            local_178._8_8_ =
                 std::
                 _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:2977:33)>
                 ::_M_invoke;
            local_178._0_8_ =
                 std::
                 _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:2977:33)>
                 ::_M_manager;
            local_188._M_unused._M_object = this;
            loadBasicJsonInfo(this,(json *)(local_178 + 0x18),
                              (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                               *)&local_188);
            if ((_func_int **)local_178._0_8_ != (_func_int **)0x0) {
              (*(code *)local_178._0_8_)(&local_188,&local_188,3);
            }
            fileops::generateJsonString(__return_storage_ptr__,(json *)(local_178 + 0x18),true);
            goto LAB_00313239;
          }
        }
        break;
      }
      local_160.m_type = 0;
      local_160.m_value.object = (object_t *)0x0;
      local_188._M_unused._M_object = (CommonCore *)0x0;
      local_188._8_8_ = (CommonCore *)0x0;
      local_178._8_8_ =
           std::
           _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:2968:33)>
           ::_M_invoke;
      local_178._0_8_ =
           std::
           _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:2968:33)>
           ::_M_manager;
      loadBasicJsonInfo(this,(json *)(local_178 + 0x18),
                        (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                         *)&local_188);
      if ((_func_int **)local_178._0_8_ != (_func_int **)0x0) {
        (*(code *)local_178._0_8_)(&local_188,&local_188,3);
      }
      val = brokerStateName_abi_cxx11_((this->super_BrokerBase).brokerState._M_i);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
      pvVar14 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)(local_178 + 0x18),"state");
      vVar1 = (pvVar14->m_data).m_type;
      (pvVar14->m_data).m_type = local_50.m_type;
      jVar6 = (pvVar14->m_data).m_value;
      (pvVar14->m_data).m_value = local_50.m_value;
      local_50.m_type = vVar1;
      local_50.m_value = jVar6;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_50);
      fileops::generateJsonString(__return_storage_ptr__,(json *)(local_178 + 0x18),true);
      goto LAB_00313239;
    case (helics *)0xe:
switchD_00312386_caseD_e:
      iVar9 = bcmp(pcVar26,"filtered_endpoints",__n);
      if (iVar9 == 0) {
        filteredEndpointQuery_abi_cxx11_(__return_storage_ptr__,this,(FederateState *)0x0);
        goto LAB_00312538;
      }
      switch(__n) {
      case 10:
        goto switchD_00312836_caseD_a;
      case 0xb:
        goto switchD_00312386_caseD_7;
      case 0xc:
        goto switchD_00312386_caseD_8;
      case 0xd:
        goto switchD_00312386_caseD_9;
      }
    }
    cVar12 = std::
             _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
             ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
                     *)mapIndex,(key_type *)&local_150);
    pcVar26 = local_150._M_str;
    if (cVar12._M_node == (_Base_ptr)(mapIndex + 8)) {
      if ((helics *)local_150._M_len == (helics *)0xc) {
        iVar9 = bcmp(local_150._M_str,"dependencies",0xc);
        if (iVar9 == 0) {
          local_160.m_type = 0;
          local_160.m_value.object = (object_t *)0x0;
          local_178._0_8_ = (_func_int **)0x0;
          local_178._8_8_ = (_func_int **)0x0;
          local_188._M_unused._M_object = (CommonCore *)0x0;
          local_188._8_8_ = (CommonCore *)0x0;
          loadBasicJsonInfo(this,(json *)(local_178 + 0x18),
                            (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                             *)&local_188);
          if ((_func_int **)local_178._0_8_ != (_func_int **)0x0) {
            (*(code *)local_178._0_8_)(&local_188,&local_188,3);
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)local_60,(initializer_list_t)ZEXT816(0),false,array);
          pvVar14 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)(local_178 + 0x18),"dependents");
          vVar1 = (pvVar14->m_data).m_type;
          (pvVar14->m_data).m_type = local_60[0];
          jVar6 = (pvVar14->m_data).m_value;
          (pvVar14->m_data).m_value = (json_value)local_60._8_8_;
          local_60[0] = vVar1;
          local_60._8_8_ = jVar6;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)local_60);
          BaseTimeCoordinator::getDependents
                    ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                     &local_188,
                     (this->super_BrokerBase).timeCoord._M_t.
                     super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                     .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
          uVar7 = local_188._8_8_;
          if (local_188._M_unused._M_object != (void *)local_188._8_8_) {
            uVar17 = local_188._M_unused._0_8_;
            do {
              pvVar14 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                    *)(local_178 + 0x18),"dependents");
              local_118.internalTimeCode = 0;
              jStack_110.object = (object_t *)0x0;
              nlohmann::json_abi_v3_11_3::detail::
              external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
              construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_118,
                         (long)*(int *)&(((CommonCore *)uVar17)->super_Core)._vptr_Core);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::push_back(pvVar14,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)&local_118);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data((data *)&local_118);
              uVar17 = (long)&(((CommonCore *)uVar17)->super_Core)._vptr_Core + 4;
            } while (uVar17 != uVar7);
          }
          if ((CommonCore *)local_188._M_unused._0_8_ != (CommonCore *)0x0) {
            operator_delete(local_188._M_unused._M_object,local_178._0_8_ - local_188._0_8_);
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)(local_80 + 0x10),(initializer_list_t)ZEXT816(0),false,array);
          pvVar14 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)(local_178 + 0x18),"dependencies");
          vVar1 = (pvVar14->m_data).m_type;
          (pvVar14->m_data).m_type = local_80[0x10];
          jVar6 = (pvVar14->m_data).m_value;
          (pvVar14->m_data).m_value = (json_value)local_80._24_8_;
          local_80[0x10] = vVar1;
          local_80._24_8_ = jVar6;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)(local_80 + 0x10));
          BaseTimeCoordinator::getDependencies
                    ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                     &local_188,
                     (this->super_BrokerBase).timeCoord._M_t.
                     super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                     .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
          uVar7 = local_188._8_8_;
          if (local_188._M_unused._M_object != (void *)local_188._8_8_) {
            uVar17 = local_188._M_unused._0_8_;
            do {
              pvVar14 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                    *)(local_178 + 0x18),"dependencies");
              local_118.internalTimeCode = 0;
              jStack_110.object = (object_t *)0x0;
              nlohmann::json_abi_v3_11_3::detail::
              external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
              construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_118,
                         (long)*(int *)&(((CommonCore *)uVar17)->super_Core)._vptr_Core);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::push_back(pvVar14,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)&local_118);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data((data *)&local_118);
              uVar17 = (long)&(((CommonCore *)uVar17)->super_Core)._vptr_Core + 4;
            } while (uVar17 != uVar7);
          }
          if ((CommonCore *)local_188._M_unused._0_8_ != (CommonCore *)0x0) {
            operator_delete(local_188._M_unused._M_object,local_178._0_8_ - local_188._0_8_);
          }
          fileops::generateJsonString(__return_storage_ptr__,(json *)(local_178 + 0x18),true);
        }
        else {
          iVar9 = bcmp(pcVar26,"federate_map",0xc);
          if (iVar9 != 0) goto LAB_003129e0;
          local_160.m_type = 0;
          local_160.m_value.object = (object_t *)0x0;
          local_188._M_unused._M_object = (CommonCore *)0x0;
          local_188._8_8_ = (CommonCore *)0x0;
          local_178._8_8_ =
               std::
               _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3024:33)>
               ::_M_invoke;
          local_178._0_8_ =
               std::
               _Function_handler<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3024:33)>
               ::_M_manager;
          loadBasicJsonInfo(this,(json *)(local_178 + 0x18),
                            (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                             *)&local_188);
          if ((_func_int **)local_178._0_8_ != (_func_int **)0x0) {
            (*(code *)local_178._0_8_)(&local_188,&local_188,3);
          }
          if ((this->tags).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (this->tags).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_188,(initializer_list_t)ZEXT816(0),false,object);
            ppVar18 = (this->tags).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar4 = (this->tags).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (ppVar18 != ppVar4) {
              do {
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)local_100,&ppVar18->second);
                pcVar5 = (ppVar18->first)._M_dataplus._M_p;
                local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_c0,pcVar5,pcVar5 + (ppVar18->first)._M_string_length);
                pvVar14 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                        *)&local_188,&local_c0);
                vVar1 = (pvVar14->m_data).m_type;
                (pvVar14->m_data).m_type = local_100[0];
                jVar6 = (pvVar14->m_data).m_value;
                (pvVar14->m_data).m_value = (json_value)local_100._8_8_;
                local_100[0] = vVar1;
                local_100._8_8_ = jVar6;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                  operator_delete(local_c0._M_dataplus._M_p,
                                  local_c0.field_2._M_allocated_capacity + 1);
                }
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::data::~data((data *)local_100);
                ppVar18 = ppVar18 + 1;
              } while (ppVar18 != ppVar4);
            }
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)local_80,
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_188);
            pvVar14 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)(local_178 + 0x18),"tags");
            vVar1 = (pvVar14->m_data).m_type;
            (pvVar14->m_data).m_type = local_80[0];
            jVar6 = (pvVar14->m_data).m_value;
            (pvVar14->m_data).m_value = (json_value)local_80._8_8_;
            local_80[0] = vVar1;
            local_80._8_8_ = jVar6;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)local_80);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)&local_188);
          }
          fileops::generateJsonString(__return_storage_ptr__,(json *)(local_178 + 0x18),true);
        }
LAB_00313239:
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)(local_178 + 0x18));
      }
      else {
LAB_003129e0:
        ppVar18 = (this->tags).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar4 = (this->tags).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar18 != ppVar4) {
          psVar13 = &ppVar18->second;
          do {
            if ((helics *)local_150._M_len == (helics *)psVar13[-1]._M_string_length) {
              if ((helics *)local_150._M_len == (helics *)0x0) {
                bVar8 = true;
              }
              else {
                iVar9 = bcmp(local_150._M_str,psVar13[-1]._M_dataplus._M_p,local_150._M_len);
                bVar8 = iVar9 == 0;
              }
            }
            else {
              bVar8 = false;
            }
            if ((bVar8) && (generateJsonQuotedString(__return_storage_ptr__,psVar13), bVar8))
            goto LAB_00312538;
            ppVar18 = (pointer)(psVar13 + 1);
            psVar13 = psVar13 + 2;
          } while (ppVar18 != ppVar4);
        }
        local_188._M_unused._M_object = (CommonCore *)local_178;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_188,"unrecognized core query","");
        generateJsonErrorResponse(__return_storage_ptr__,BAD_REQUEST,(string *)&local_188);
        if ((CommonCore *)local_188._M_unused._0_8_ != (CommonCore *)local_178) {
          pcVar21 = (code *)(local_178._0_8_ + 1);
LAB_00312e5e:
          operator_delete(local_188._M_unused._M_object,(ulong)pcVar21);
        }
      }
    }
    else {
      index = *(ushort *)&cVar12._M_node[1]._M_left;
      uVar10 = (uint)index;
      ptVar3 = (this->mapBuilders).
               super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((uint)index <
           (((uint)(*(int *)&(this->mapBuilders).
                             super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (int)ptVar3) >> 5) *
            -0x55555555 & 0xffff)) && (*(char *)((long)&cVar12._M_node[1]._M_left + 2) == '\0')) {
        this_01 = (JsonMapBuilder *)
                  ((long)&(ptVar3->
                          super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                          ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>.
                          _M_head_impl.jMap._M_t.
                          super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                          .
                          super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
                          ._M_head_impl + (ulong)(uVar10 * 0x60));
        bVar8 = fileops::JsonMapBuilder::isCompleted(this_01);
        if (bVar8) {
          iVar11 = generateMapObjectCounter(this);
          iVar9 = *(int *)((long)&(ptVar3->
                                  super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                  ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>.
                                  _M_head_impl.counterCode + (ulong)(uVar10 * 0x60));
          local_120.internalTimeCode._0_4_ = iVar11;
          if (iVar11 == iVar9) {
            fileops::JsonMapBuilder::generate_abi_cxx11_(__return_storage_ptr__,this_01);
          }
          else {
            fileops::JsonMapBuilder::reset(this_01);
          }
          if ((int)local_120.internalTimeCode == iVar9) goto LAB_00312538;
        }
        if ((this_01->jMap)._M_t.
            super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
            .
            super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
            ._M_head_impl !=
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)0x0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"#wait","");
          goto LAB_00312538;
        }
      }
      request._M_str = local_150._M_str;
      request._M_len = local_150._M_len;
      initializeMapBuilder
                (this,request,index,*(QueryReuse *)((long)&cVar12._M_node[1]._M_left + 2),
                 force_ordering);
      bVar8 = fileops::JsonMapBuilder::isCompleted
                        ((JsonMapBuilder *)
                         ((long)&(((this->mapBuilders).
                                   super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                                 ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>.
                                 _M_head_impl.jMap._M_t.
                                 super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                                 .
                                 super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
                                 ._M_head_impl + (ulong)(uVar10 * 0x60)));
      if (bVar8) {
        if (*(char *)((long)&cVar12._M_node[1]._M_left + 2) == '\0') {
          iVar9 = generateMapObjectCounter(this);
          *(int *)((long)&(((this->mapBuilders).
                            super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                          ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>.
                          _M_head_impl.counterCode + (ulong)(uVar10 * 0x60)) = iVar9;
        }
        fileops::JsonMapBuilder::generate_abi_cxx11_
                  (__return_storage_ptr__,
                   (JsonMapBuilder *)
                   ((long)&(((this->mapBuilders).
                             super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                           ).super__Head_base<0UL,_helics::fileops::JsonMapBuilder,_false>.
                           _M_head_impl.jMap._M_t.
                           super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                           .
                           super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
                           ._M_head_impl + (ulong)(uVar10 * 0x60)));
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"#wait","")
        ;
      }
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p == &local_140.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,local_140.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_140.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_140._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,local_140.field_2._M_local_buf[0])
      ;
    }
    __return_storage_ptr__->_M_string_length = local_140._M_string_length;
    local_140._M_string_length = 0;
    local_140.field_2._M_local_buf[0] = '\0';
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  }
LAB_00312538:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,
                    CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                             local_140.field_2._M_local_buf[0]) + 1);
  }
LAB_0031225f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._0_8_ != &local_d0) {
    operator_delete((void *)local_e0._0_8_,
                    CONCAT71(local_d0._M_allocated_capacity._1_7_,local_d0._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CommonCore::coreQuery(std::string_view queryStr, bool force_ordering) const
{
    auto addHeader = [this](nlohmann::json& base) { loadBasicJsonInfo(base, nullptr); };

    auto res = quickCoreQueries(queryStr);
    if (!res.empty()) {
        return res;
    }
    if (queryStr == "federates") {
        return generateStringVector(loopFederates,
                                    [](const auto& fed) { return fed->getIdentifier(); });
    }
    if (queryStr == "tags") {
        nlohmann::json tagBlock = nlohmann::json::object();
        for (const auto& tag : tags) {
            tagBlock[tag.first] = tag.second;
        }
        return fileops::generateJsonString(tagBlock);
    }
    if (queryStr.compare(0, 4, "tag/") == 0) {
        std::string_view queriedTag = queryStr;
        queriedTag.remove_prefix(4);
        for (const auto& tag : tags) {
            if (queriedTag == tag.first) {
                return generateJsonQuotedString(tag.second);
            }
        }
        return "\"\"";
    }
    auto interfaceQueryResult =
        generateInterfaceQueryResults(queryStr, loopHandles, GlobalFederateId{}, addHeader);
    if (!interfaceQueryResult.empty()) {
        return interfaceQueryResult;
    }
    if (queryStr == "dependson") {
        return generateStringVector(timeCoord->getDependencies(),
                                    [](auto& dep) { return std::to_string(dep.baseValue()); });
    }
    if (queryStr == "dependents") {
        return generateStringVector(timeCoord->getDependents(),
                                    [](auto& dep) { return std::to_string(dep.baseValue()); });
    }

    if (queryStr == "isinit") {
        return (allInitReady()) ? "true" : "false";
    }
    if (queryStr == "logs") {
        nlohmann::json base;
        loadBasicJsonInfo(base, nullptr);
        bufferToJson(mLogManager->getLogBuffer(), base);
        return fileops::generateJsonString(base);
    }
    if (queryStr == "address") {
        return generateJsonQuotedString(getAddress());
    }
    if (queryStr == "counter") {
        return fmt::format("{}", generateMapObjectCounter());
    }
    if (queryStr == "filtered_endpoints") {
        return filteredEndpointQuery(nullptr);
    }
    if (queryStr == "current_time") {
        if (!hasTimeDependency) {
            return "{}";
        }
        return timeCoord->printTimeStatus();
    }
    if (queryStr == "version_all") {
        nlohmann::json base;
        loadBasicJsonInfo(base, [](nlohmann::json& /*val*/, const FedInfo& /*fed*/) {});
        base["version"] = versionString;
        return fileops::generateJsonString(base);
    }
    if (queryStr == "current_state") {
        nlohmann::json base;
        loadBasicJsonInfo(base, [](nlohmann::json& val, const FedInfo& fed) {
            val["state"] = stateString(fed.state);
        });
        base["state"] = brokerStateName(getBrokerState());

        return fileops::generateJsonString(base);
    }
    if (queryStr == "interfaces") {
        nlohmann::json base;
        loadBasicJsonInfo(base, [this](nlohmann::json& val, const FedInfo& fed) {
            generateInterfaceConfig(val, loopHandles, fed->global_id);
        });
        return fileops::generateJsonString(base);
    }
    auto maploc = mapIndex.find(queryStr);
    if (maploc != mapIndex.end()) {
        auto index = maploc->second.first;
        if (isValidIndex(index, mapBuilders) && maploc->second.second == QueryReuse::ENABLED) {
            auto& builder = std::get<0>(mapBuilders[index]);
            if (builder.isCompleted()) {
                auto center = generateMapObjectCounter();
                if (center == builder.getCounterCode()) {
                    return builder.generate();
                }
                builder.reset();
            }
            if (builder.isActive()) {
                return "#wait";
            }
        }

        initializeMapBuilder(queryStr, index, maploc->second.second, force_ordering);
        if (std::get<0>(mapBuilders[index]).isCompleted()) {
            if (maploc->second.second == QueryReuse::ENABLED) {
                auto center = generateMapObjectCounter();
                std::get<0>(mapBuilders[index]).setCounterCode(center);
            }
            return std::get<0>(mapBuilders[index]).generate();
        }
        return "#wait";
    }
    if (queryStr == "dependencies") {
        nlohmann::json base;
        loadBasicJsonInfo(base, nullptr);
        base["dependents"] = nlohmann::json::array();
        for (const auto& dep : timeCoord->getDependents()) {
            base["dependents"].push_back(dep.baseValue());
        }
        base["dependencies"] = nlohmann::json::array();
        for (const auto& dep : timeCoord->getDependencies()) {
            base["dependencies"].push_back(dep.baseValue());
        }
        return fileops::generateJsonString(base);
    }
    if (queryStr == "federate_map") {
        nlohmann::json base;
        loadBasicJsonInfo(base, [](nlohmann::json& val, const FedInfo& fed) {
            if (fed.fed->try_lock()) {
                addFederateTags(val, fed.fed);
                fed.fed->unlock();
            } else {
                addFederateTags(val, fed.fed);
            }
        });
        // add core tags if needed
        if (!tags.empty()) {
            nlohmann::json tagBlock = nlohmann::json::object();
            for (const auto& tag : tags) {
                tagBlock[tag.first] = tag.second;
            }
            base["tags"] = tagBlock;
        }
        return fileops::generateJsonString(base);
    }
    // check tag value for a matching string
    for (const auto& tag : tags) {
        if (tag.first == queryStr) {
            return generateJsonQuotedString(tag.second);
        }
    }
    // if nothing found generate an error response
    return generateJsonErrorResponse(JsonErrorCodes::BAD_REQUEST, "unrecognized core query");
}